

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

size_t gf2Create_deep(size_t m)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t n;
  size_t in_stack_ffffffffffffffa0;
  
  sVar1 = gf2MulTrinomial0_deep(0x1889e9);
  sVar2 = gf2SqrTrinomial0_deep(0x1889f8);
  sVar3 = gf2MulTrinomial1_deep(0x188a07);
  sVar4 = gf2SqrTrinomial1_deep(0x188a16);
  sVar5 = gf2MulPentanomial_deep(0x188a25);
  sVar6 = gf2SqrPentanomial_deep(0x188a34);
  sVar7 = gf2Inv_deep(in_stack_ffffffffffffffa0);
  sVar8 = gf2Div_deep(in_stack_ffffffffffffffa0);
  sVar1 = utilMax(8,sVar1,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8);
  return sVar1;
}

Assistant:

size_t gf2Create_deep(size_t m)
{
	const size_t n = W_OF_B(m);
	return utilMax(8, 
		gf2MulTrinomial0_deep(n),
		gf2SqrTrinomial0_deep(n),
		gf2MulTrinomial1_deep(n),
		gf2SqrTrinomial1_deep(n),
		gf2MulPentanomial_deep(n),
		gf2SqrPentanomial_deep(n),
		gf2Inv_deep(n),
		gf2Div_deep(n));
}